

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_36::HttpClientAdapter::ResponseImpl::~ResponseImpl(ResponseImpl *this)

{
  PromiseArenaMember *node;
  PromiseFulfiller<kj::HttpClient::Response> *pPVar1;
  Disposer *pDVar2;
  
  node = &((this->task).super_PromiseBase.node.ptr)->super_PromiseArenaMember;
  if (node != (PromiseArenaMember *)0x0) {
    (this->task).super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(node);
  }
  pPVar1 = (this->fulfiller).ptr;
  if (pPVar1 != (PromiseFulfiller<kj::HttpClient::Response> *)0x0) {
    (this->fulfiller).ptr = (PromiseFulfiller<kj::HttpClient::Response> *)0x0;
    pDVar2 = (this->fulfiller).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(pPVar1->super_PromiseRejector)._vptr_PromiseRejector[-2] +
                      (long)&(pPVar1->super_PromiseRejector)._vptr_PromiseRejector);
  }
  Refcounted::~Refcounted(&this->super_Refcounted);
  operator_delete(this,0x30);
  return;
}

Assistant:

ResponseImpl(kj::HttpMethod method,
                 kj::Own<kj::PromiseFulfiller<HttpClient::Response>> fulfiller)
        : method(method), fulfiller(kj::mv(fulfiller)) {}